

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O1

int svd_gr2(double *A,int M,int N,double *U,double *V,double *q)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *__ptr;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  double *pdVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  double *pdVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double __x;
  double dVar37;
  double dVar38;
  double dVar39;
  double *local_120;
  ulong local_e8;
  double *local_c0;
  int local_b0;
  ulong local_a8;
  double *local_90;
  void *local_78;
  ulong local_70;
  double *local_60;
  double *local_58;
  ulong local_38;
  
  if (M < N) {
    puts("Rows (M) should be greater than Columns (B) ");
    printf("Retry By Transposing the Input Matrix");
    iVar2 = -1;
  }
  else {
    uVar17 = (ulong)(uint)N;
    __ptr = malloc((long)N << 3);
    dVar32 = macheps();
    if (0 < N * M) {
      uVar10 = 0;
      do {
        U[uVar10] = A[uVar10];
        uVar10 = uVar10 + 1;
      } while ((uint)(N * M) != uVar10);
    }
    lVar5 = (long)M;
    uVar10 = (ulong)(uint)M;
    if (N < 1) {
      dVar39 = 0.0;
      dVar33 = 0.0;
      local_38 = uVar17;
    }
    else {
      pdVar9 = U + 1;
      local_90 = U + uVar17;
      local_70 = 1;
      uVar31 = 0;
      dVar39 = 0.0;
      pdVar6 = U;
      uVar18 = uVar17;
      uVar19 = 0;
      dVar35 = 0.0;
      local_c0 = U;
      local_a8 = uVar10;
      local_78 = __ptr;
      do {
        *(double *)((long)__ptr + uVar19 * 8) = dVar39;
        dVar39 = 0.0;
        uVar7 = local_a8;
        pdVar8 = pdVar6;
        if ((long)uVar19 < lVar5) {
          do {
            dVar39 = dVar39 + *pdVar8 * *pdVar8;
            uVar7 = uVar7 - 1;
            pdVar8 = pdVar8 + uVar17;
          } while (uVar7 != 0);
        }
        local_38 = uVar19 + 1;
        dVar33 = 0.0;
        if (dVar32 * dVar32 <= dVar39) {
          iVar2 = (N + 1) * (int)uVar19;
          dVar38 = U[iVar2];
          if (dVar39 < 0.0) {
            dVar33 = sqrt(dVar39);
          }
          else {
            dVar33 = SQRT(dVar39);
          }
          dVar33 = (double)(~-(ulong)(dVar38 < 0.0) & (ulong)-dVar33 |
                           -(ulong)(dVar38 < 0.0) & (ulong)dVar33);
          U[iVar2] = dVar38 - dVar33;
          if (local_38 < uVar17) {
            pdVar8 = pdVar9;
            uVar7 = local_70;
            do {
              dVar34 = 0.0;
              if ((long)uVar19 < lVar5) {
                lVar21 = 0;
                uVar14 = local_a8;
                do {
                  dVar34 = dVar34 + *(double *)((long)pdVar6 + lVar21) *
                                    *(double *)((long)pdVar8 + lVar21);
                  lVar21 = lVar21 + uVar17 * 8;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              if ((long)uVar19 < lVar5) {
                lVar21 = 0;
                uVar14 = local_a8;
                do {
                  *(double *)((long)pdVar8 + lVar21) =
                       *(double *)((long)pdVar6 + lVar21) * (dVar34 / (dVar38 * dVar33 - dVar39)) +
                       *(double *)((long)pdVar8 + lVar21);
                  lVar21 = lVar21 + uVar17 * 8;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              uVar7 = uVar7 + 1;
              pdVar8 = pdVar8 + 1;
            } while (uVar7 != uVar17);
          }
        }
        dVar38 = 0.0;
        q[uVar19] = dVar33;
        if (local_38 < uVar17) {
          dVar38 = 0.0;
          uVar7 = 1;
          do {
            dVar38 = dVar38 + local_c0[uVar31 + uVar7] * local_c0[uVar31 + uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar18 != uVar7);
        }
        dVar39 = 0.0;
        if (dVar32 * dVar32 <= dVar38) {
          uVar30 = (int)local_38 + (int)uVar19 * N;
          dVar33 = U[uVar30];
          if (dVar38 < 0.0) {
            dVar39 = sqrt(dVar38);
          }
          else {
            dVar39 = SQRT(dVar38);
          }
          dVar39 = (double)(~-(ulong)(dVar33 < 0.0) & (ulong)-dVar39 |
                           -(ulong)(dVar33 < 0.0) & (ulong)dVar39);
          U[uVar30] = dVar33 - dVar39;
          if (local_38 < uVar17) {
            uVar7 = 1;
            do {
              *(double *)((long)local_78 + uVar7 * 8) =
                   local_c0[uVar31 + uVar7] / (dVar33 * dVar39 - dVar38);
              uVar7 = uVar7 + 1;
            } while (uVar18 != uVar7);
          }
          pdVar8 = local_90;
          uVar7 = local_70;
          if ((long)local_38 < lVar5) {
            do {
              dVar33 = 0.0;
              if (local_38 < uVar17) {
                uVar14 = 1;
                do {
                  dVar33 = dVar33 + pdVar8[uVar14] * local_c0[uVar31 + uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
              if (local_38 < uVar17) {
                uVar14 = 1;
                do {
                  pdVar8[uVar14] =
                       *(double *)((long)local_78 + uVar14 * 8) * dVar33 + pdVar8[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
              uVar7 = uVar7 + 1;
              pdVar8 = pdVar8 + uVar17;
            } while (uVar7 != uVar10);
          }
        }
        dVar33 = ABS(*(double *)((long)__ptr + uVar19 * 8)) + ABS(q[uVar19]);
        if (dVar33 <= dVar35) {
          dVar33 = dVar35;
        }
        local_70 = local_70 + 1;
        pdVar6 = pdVar6 + uVar17 + 1;
        local_a8 = local_a8 - 1;
        pdVar9 = pdVar9 + uVar17 + 1;
        local_c0 = local_c0 + 1;
        uVar31 = uVar31 + N;
        uVar18 = uVar18 - 1;
        local_78 = (void *)((long)local_78 + 8);
        local_90 = local_90 + uVar17 + 1;
        uVar19 = local_38;
        dVar35 = dVar33;
      } while (local_38 != uVar17);
    }
    uVar31 = N - 1;
    lVar21 = (long)(int)uVar31;
    if (0 < N) {
      lVar15 = (uVar17 - 1) * uVar17;
      pdVar9 = U + lVar15;
      lVar11 = uVar17 * 8;
      pdVar6 = V + uVar17;
      local_58 = V + -1;
      pdVar8 = V + lVar15;
      uVar18 = uVar17;
      do {
        pdVar6 = pdVar6 + -1;
        uVar19 = uVar18 - 1;
        if ((long)uVar18 <= lVar21) {
          if ((dVar39 != 0.0) || (NAN(dVar39))) {
            if ((int)local_38 < N) {
              dVar35 = U[uVar19 * uVar17 + uVar18];
              uVar7 = (ulong)(int)local_38;
              pdVar23 = (double *)(lVar11 * uVar7 + (long)pdVar6);
              do {
                *pdVar23 = pdVar9[uVar7] / (dVar39 * dVar35);
                uVar7 = uVar7 + 1;
                pdVar23 = pdVar23 + uVar17;
              } while (uVar17 != uVar7);
            }
            if ((int)local_38 < N) {
              uVar14 = (ulong)(int)local_38;
              pdVar23 = (double *)((uVar17 * 8 + 8) * uVar14 + (long)V);
              uVar7 = uVar14;
              do {
                dVar39 = 0.0;
                uVar16 = uVar14;
                pdVar28 = pdVar23;
                do {
                  dVar39 = dVar39 + pdVar9[uVar16] * *pdVar28;
                  uVar16 = uVar16 + 1;
                  pdVar28 = pdVar28 + uVar17;
                } while (uVar17 != uVar16);
                lVar29 = 0;
                lVar15 = uVar17 - uVar14;
                do {
                  *(double *)((long)pdVar23 + lVar29) =
                       *(double *)((long)local_58 + lVar29 + (uVar14 * 8 + 8) * uVar17) * dVar39 +
                       *(double *)((long)pdVar23 + lVar29);
                  lVar29 = lVar29 + lVar11;
                  lVar15 = lVar15 + -1;
                } while (lVar15 != 0);
                uVar7 = uVar7 + 1;
                pdVar23 = pdVar23 + 1;
              } while (uVar7 != uVar17);
            }
          }
          if ((int)local_38 < N) {
            uVar7 = (ulong)(int)local_38;
            pdVar23 = (double *)(lVar11 * uVar7 + (long)pdVar6);
            do {
              *pdVar23 = 0.0;
              pdVar8[uVar7] = 0.0;
              uVar7 = uVar7 + 1;
              pdVar23 = pdVar23 + uVar17;
            } while (uVar17 != uVar7);
          }
        }
        V[uVar19 + (long)((int)uVar19 * N)] = 1.0;
        dVar39 = *(double *)((long)__ptr + uVar19 * 8);
        pdVar9 = pdVar9 + -uVar17;
        local_58 = local_58 + -1;
        pdVar8 = pdVar8 + -uVar17;
        local_38 = uVar19 & 0xffffffff;
        bVar1 = 1 < (long)uVar18;
        uVar18 = uVar19;
      } while (bVar1);
    }
    local_e8 = (ulong)uVar31;
    if (0 < N) {
      uVar12 = N * N;
      uVar3 = ~N;
      local_60 = U + uVar17 * uVar17 + -1;
      uVar22 = (N + 1U) * N;
      uVar30 = uVar22 - 1;
      uVar27 = uVar12 - 1;
      uVar19 = 0;
      uVar18 = uVar17;
      local_78._0_4_ = uVar12;
      do {
        dVar39 = q[uVar18 - 1];
        if ((long)uVar18 < (long)uVar17 && (long)uVar18 <= lVar21) {
          memset(U + (int)(uVar3 * (int)uVar19 + uVar12),0,
                 (uVar19 * 8 + 0x7fffffff8 & 0x7fffffff8) + 8);
        }
        uVar7 = uVar18 - 1;
        if ((dVar39 != 0.0) || (NAN(dVar39))) {
          if ((long)uVar18 < (long)uVar17 && uVar7 != local_e8) {
            uVar14 = uVar18 & 0xffffffff;
            uVar13 = (uint)local_78;
            uVar20 = uVar22;
            do {
              dVar35 = 0.0;
              if ((long)uVar18 < lVar5) {
                uVar16 = uVar18 & 0xffffffff;
                uVar25 = uVar30;
                uVar26 = uVar20;
                do {
                  dVar35 = dVar35 + U[uVar25] * U[uVar26];
                  uVar26 = uVar26 + N;
                  uVar25 = uVar25 + N;
                  uVar24 = (int)uVar16 + 1;
                  uVar16 = (ulong)uVar24;
                } while ((int)uVar24 < M);
              }
              if ((long)uVar18 <= lVar5) {
                dVar38 = U[uVar7 * (N + 1U)];
                uVar24 = uVar31;
                uVar26 = uVar27;
                uVar25 = uVar13;
                do {
                  U[uVar25] = U[uVar26] * ((dVar35 / dVar38) / dVar39) + U[uVar25];
                  uVar25 = uVar25 + N;
                  uVar26 = uVar26 + N;
                  uVar24 = uVar24 + 1;
                } while ((int)uVar24 < M);
              }
              uVar26 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar26;
              uVar20 = uVar20 + 1;
              uVar13 = uVar13 + 1;
            } while (uVar26 != N);
          }
          uVar14 = lVar5 + 1U;
          pdVar9 = local_60;
          if ((long)uVar18 <= lVar5) {
            do {
              *pdVar9 = *pdVar9 / dVar39;
              uVar14 = uVar14 - 1;
              pdVar9 = pdVar9 + uVar17;
            } while (uVar18 != uVar14);
          }
        }
        else {
          uVar14 = lVar5 + 1U;
          pdVar9 = local_60;
          if ((long)uVar18 <= lVar5) {
            do {
              *pdVar9 = 0.0;
              pdVar9 = pdVar9 + uVar17;
              uVar14 = uVar14 - 1;
            } while (uVar18 != uVar14);
          }
        }
        lVar11 = (long)((int)uVar7 * N);
        U[uVar7 + lVar11] = U[uVar7 + lVar11] + 1.0;
        uVar19 = uVar19 + 1;
        local_60 = (double *)((long)local_60 + (uVar17 * 8 ^ 0xfffffffffffffff8));
        uVar22 = uVar22 + uVar3;
        uVar30 = uVar30 + uVar3;
        local_78._0_4_ = (uint)local_78 + uVar3;
        uVar27 = uVar27 + uVar3;
        uVar31 = uVar31 - 1;
        uVar18 = uVar7;
      } while (uVar19 != uVar17);
    }
    if (0 < N) {
      dVar32 = dVar32 * dVar33;
      local_120 = V + uVar17;
      uVar18 = uVar17 - 1;
      local_b0 = N;
LAB_0013ff59:
      local_120 = local_120 + -1;
      uVar7 = uVar18 - 1;
      iVar4 = 1;
      uVar19 = local_e8;
      iVar2 = local_b0;
LAB_0013ff7f:
      if (dVar32 < ABS(*(double *)((long)__ptr + uVar19 * 8))) {
        if (dVar32 < ABS(q[uVar19 - 1])) goto code_r0x0013ffa4;
        goto LAB_0013ffad;
      }
      goto LAB_00140101;
    }
LAB_00140564:
    svd_sort(U,M,N,V,q);
    free(__ptr);
    iVar2 = 0;
  }
  return iVar2;
code_r0x0013ffa4:
  uVar19 = uVar19 - 1;
  iVar2 = iVar2 + -1;
  if (0 < iVar2) goto LAB_0013ff7f;
LAB_0013ffad:
  iVar2 = (int)uVar19;
  if ((long)iVar2 <= (long)uVar18) {
    lVar11 = (long)((uVar19 << 0x20) + -0x100000000) >> 0x1d;
    lVar5 = (long)iVar2 * 8;
    dVar39 = 0.0;
    dVar33 = 1.0;
    lVar21 = (long)iVar2;
    do {
      dVar35 = *(double *)((long)__ptr + lVar21 * 8);
      dVar33 = dVar33 * dVar35;
      *(double *)((long)__ptr + lVar21 * 8) = dVar39 * dVar35;
      if (ABS(dVar33) <= dVar32) break;
      dVar39 = q[lVar21];
      dVar35 = hypot(dVar33,dVar39);
      q[lVar21] = dVar35;
      dVar39 = dVar39 / dVar35;
      dVar33 = -dVar33 / dVar35;
      uVar14 = uVar10;
      pdVar9 = U;
      if (0 < M) {
        do {
          dVar35 = *(double *)((long)pdVar9 + lVar11);
          dVar38 = *(double *)((long)pdVar9 + lVar5);
          *(double *)((long)pdVar9 + lVar11) = dVar35 * dVar39 + dVar33 * dVar38;
          *(double *)((long)pdVar9 + lVar5) = dVar38 * dVar39 - dVar33 * dVar35;
          uVar14 = uVar14 - 1;
          pdVar9 = pdVar9 + uVar17;
        } while (uVar14 != 0);
      }
      lVar5 = lVar5 + 8;
      bVar1 = lVar21 < (long)uVar18;
      lVar21 = lVar21 + 1;
    } while (bVar1);
  }
LAB_00140101:
  dVar39 = q[uVar18];
  if ((uVar19 & 0xffffffff) != uVar18) {
    lVar5 = (long)(int)uVar19;
    dVar33 = q[lVar5];
    dVar35 = q[uVar7];
    dVar38 = *(double *)((long)__ptr + uVar7 * 8);
    dVar34 = *(double *)((long)__ptr + uVar18 * 8);
    dVar38 = ((dVar35 / dVar34 + ((dVar38 - dVar39) / dVar35) * ((dVar39 + dVar38) / dVar34)) -
             dVar34 / dVar35) * 0.5;
    dVar36 = hypot(dVar38,1.0);
    dVar39 = (dVar34 / dVar33) *
             (dVar35 / ((double)((ulong)-dVar36 & -(ulong)(dVar38 < 0.0) |
                                ~-(ulong)(dVar38 < 0.0) & (ulong)dVar36) + dVar38) - dVar34) +
             (dVar33 - (dVar39 / dVar33) * dVar39);
    if (lVar5 < (long)uVar18) {
      pdVar9 = V + lVar5 + 1;
      lVar11 = lVar5 << 0x20;
      pdVar6 = U + lVar5 + 1;
      dVar38 = 1.0;
      dVar35 = 1.0;
      lVar21 = (long)(int)uVar19;
      do {
        lVar15 = lVar21 + 1;
        dVar34 = *(double *)((long)__ptr + lVar21 * 8 + 8);
        dVar36 = q[lVar21 + 1];
        dVar38 = dVar38 * dVar34;
        dVar35 = dVar35 * dVar34;
        dVar34 = hypot(dVar39,dVar38);
        *(double *)((long)__ptr + lVar21 * 8) = dVar34;
        dVar39 = dVar39 / dVar34;
        dVar34 = dVar38 / dVar34;
        __x = dVar33 * dVar39 + dVar35 * dVar34;
        dVar33 = dVar35 * dVar39 - dVar34 * dVar33;
        dVar38 = dVar36 * dVar34;
        dVar36 = dVar36 * dVar39;
        uVar19 = uVar17;
        lVar29 = lVar11;
        pdVar8 = pdVar9;
        do {
          dVar35 = *(double *)((long)V + (lVar29 >> 0x1d));
          dVar37 = *pdVar8;
          *(double *)((long)V + (lVar29 >> 0x1d)) = dVar35 * dVar39 + dVar34 * dVar37;
          *pdVar8 = dVar37 * dVar39 - dVar34 * dVar35;
          pdVar8 = pdVar8 + uVar17;
          lVar29 = lVar29 + (uVar17 << 0x20);
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
        dVar37 = hypot(__x,dVar38);
        dVar38 = dVar38 / dVar37;
        if ((dVar37 == 0.0) && (!NAN(dVar37))) {
          dVar38 = dVar34;
        }
        dVar35 = __x / dVar37;
        if ((dVar37 == 0.0) && (!NAN(dVar37))) {
          dVar35 = dVar39;
        }
        q[lVar21] = dVar37;
        uVar19 = uVar10;
        lVar21 = lVar11;
        pdVar8 = pdVar6;
        if (0 < M) {
          do {
            dVar39 = *(double *)((long)U + (lVar21 >> 0x1d));
            dVar34 = *pdVar8;
            *(double *)((long)U + (lVar21 >> 0x1d)) = dVar39 * dVar35 + dVar38 * dVar34;
            *pdVar8 = dVar34 * dVar35 - dVar38 * dVar39;
            uVar19 = uVar19 - 1;
            lVar21 = lVar21 + (uVar17 << 0x20);
            pdVar8 = pdVar8 + uVar17;
          } while (uVar19 != 0);
        }
        dVar39 = dVar35 * dVar33 + dVar36 * dVar38;
        dVar33 = dVar35 * dVar36 - dVar33 * dVar38;
        pdVar9 = pdVar9 + 1;
        lVar11 = lVar11 + 0x100000000;
        pdVar6 = pdVar6 + 1;
        lVar21 = lVar15;
      } while (lVar15 < (long)uVar18);
    }
    *(undefined8 *)((long)__ptr + lVar5 * 8) = 0;
    *(double *)((long)__ptr + uVar18 * 8) = dVar39;
    q[uVar18] = dVar33;
    iVar4 = iVar4 + 1;
    uVar19 = local_e8;
    iVar2 = local_b0;
    if (iVar4 == 0x33) {
      puts("Convergence Not Achieved ");
      return 0xf;
    }
    goto LAB_0013ff7f;
  }
  if (dVar39 < 0.0) {
    q[uVar18] = -dVar39;
    uVar19 = uVar17;
    pdVar9 = local_120;
    do {
      *pdVar9 = -*pdVar9;
      pdVar9 = pdVar9 + uVar17;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  local_e8 = local_e8 - 1;
  local_b0 = local_b0 + -1;
  bVar1 = (long)uVar18 < 1;
  uVar18 = uVar7;
  if (bVar1) goto LAB_00140564;
  goto LAB_0013ff59;
}

Assistant:

int svd_gr2(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,tol,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */
	if (M < N) {
		printf("Rows (M) should be greater than Columns (B) \n");
		printf("Retry By Transposing the Input Matrix");
		return -1;
	}
	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	tol = eps * eps;
	g = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * N;
			temp = U[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = U[i*N+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			U[i*N+i] = f - g;

			for(j = l; j < N;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * N;
					s += (U[t+i]*U[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+j] += (f * U[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * N;
    	for(k = l; k < N;++k) {
    		temp = U[t+k];
    		s = s + temp*temp;
    	}
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = U[t+l];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            U[t+l] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = U[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * N;
                for (k = l; k < N; k++) {
                     s += U[t2+k] * U[t+k];
                }
                for (k = l; k < N; k++) {
                     U[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}


//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		if (i < N - 1) {
			if (g != 0.0) {
				h = U[t+i+1] * g;
				for(j = l;j < N;++j) {
					V[j*N+i] = U[t+j] / h;
				}
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < N;++k) {
						s += U[t+k] * V[k*N+j];
					}
					for(k = l; k < N;++k) {
						V[k*N+j] += (s * V[k*N+i]);
					}
				}
			}
			for(j = l; j < N;++j) {
				V[t+j] = V[j*N+i] = 0.0;
			}
		}
	    V[t+i] = 1.0;
		g = e[i];
		l = i;
	}



//Accumulating Left Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		l = i+1;
		g = q[i];

		if (i < N - 1) {
			for(j = l;j < N;++j) {
				U[t+j] = 0.0;
			}
		}

		if (g != 0.0) {
			if (i != N - 1) {
				//h = U[t+i] * g;
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < M;++k) {
						s += (U[k*N+i] * U[k*N+j]);
					}
					f = (s / U[t+i]) / g;
					for(k = i; k < M;++k) {
						U[k*N+j] += (f * U[k*N+i]);
					}
				}
			}
			for(j = i; j < M;++j) {
				U[j*N+i] = U[j*N+i] / g;
			}
		} else {
			for(j = i; j < M;++j) {
				U[j*N+i] = 0.0;
			}
		}

		U[t+i] += 1.0;
	}
//	mdisplay(U,M,N);

	eps = eps * x;

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = 0; j < M;++j) {
						t = j * N;
						y = U[t+l1];
						z = U[t+i];

						U[t+l1] = y * c + z * s;
						U[t+i] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * N;
                        x = V[t+i-1];
                        z = V[t+i];
                        V[t+i-1] = x * c + z * s;
                        V[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = 0; j < M;++j) {
                    	t = j * N;
                        y = U[t+i-1];
                        z = U[t+i];
                        U[t+i-1] = y * c + z * s;
                        U[t+i] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j *N;
                        V[t+k] = -V[t+k];
                    }
                }
                break;
			}
		}
	}

	svd_sort(U,M,N,V,q);

	free(e);
	return ierr;
}